

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_extra_test.cc
# Opt level: O0

void __thiscall EVPExtraTest_TLSEncodedPoint_Test::TestBody(EVPExtraTest_TLSEncodedPoint_Test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  bool bVar1;
  uchar *puVar2;
  size_type sVar3;
  EVP_PKEY *__p;
  char *pcVar4;
  pointer peVar5;
  EVP_PKEY *pEVar6;
  EVP_PKEY *from;
  cbb_st *pcVar7;
  uint8_t *data_arg;
  size_t len_arg;
  char *in_R9;
  __0 *local_6b0;
  AssertHelper local_570;
  Message local_568;
  Span<const_unsigned_char> local_560;
  Bytes local_550;
  Bytes local_540;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_500;
  Message local_4f8;
  int local_4ec;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_4b8;
  Message local_4b0;
  int local_4a4;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar__5;
  ScopedCBB cbb;
  AssertHelper local_440;
  Message local_438;
  int local_42c;
  undefined1 local_428 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_3f8;
  Message local_3f0;
  int local_3e4;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_3b0;
  Message local_3a8;
  int local_39c;
  undefined1 local_398 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_368;
  Message local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<EVP_PKEY> from_encoded_point;
  Message local_338;
  Span<const_unsigned_char> local_330;
  Bytes local_320;
  Bytes local_310;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_1;
  Message local_2e8;
  uint local_2dc;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar;
  size_t len;
  uint8_t *data;
  string local_2b0;
  AssertHelper local_290;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EVP_PKEY> from_spki;
  CBS spki;
  Bytes local_248;
  ScopedTrace local_232;
  ScopedTrace local_231;
  ScopedTrace gtest_trace_1200;
  anon_struct_56_3_7c433676 *paStack_230;
  ScopedTrace gtest_trace_1199;
  anon_struct_56_3_7c433676 *test;
  anon_struct_56_3_7c433676 *__end1;
  anon_struct_56_3_7c433676 *__begin1;
  anon_struct_56_3_7c433676 (*__range1) [2];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  iterator local_1e0;
  size_type local_1d8;
  allocator<unsigned_char> local_1c9;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined4 uStack_1b0;
  undefined4 local_1ac;
  undefined4 uStack_1a8;
  undefined8 uStack_1a4;
  iterator local_190;
  size_type local_188;
  undefined1 local_17a;
  allocator<unsigned_char> local_179;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138;
  iterator local_130;
  size_type local_128;
  allocator<unsigned_char> local_109;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined3 uStack_c0;
  undefined5 local_bd;
  undefined3 uStack_b8;
  undefined8 uStack_b5;
  iterator local_a0;
  size_type local_98;
  pointer *local_90;
  undefined1 local_88 [8];
  anon_struct_56_3_7c433676 kTests [2];
  EVPExtraTest_TLSEncodedPoint_Test *this_local;
  
  __range1._5_1_ = 1;
  local_90 = (pointer *)local_88;
  local_88._0_4_ = 0x198;
  uStack_b8 = 0x6e0558;
  uStack_b5 = 0xc9e69f5b92043165;
  uStack_c8 = 0xeacff0dc90e964b6;
  uStack_c0 = 0xe2940d;
  local_bd = 0xe9dafe6a8;
  local_d8 = 0x19272c072494f8c7;
  uStack_d0 = 0xcd950e923bb3787d;
  local_e8 = 0xe0f52c256c210fe7;
  uStack_e0 = 0x65d1d59c631fce62;
  local_f8 = 0x30701033dce4886;
  uStack_f0 = 0x9c420f152c040042;
  local_108 = 0x862a070613305930;
  uStack_100 = 0x2a080601023dce48;
  local_a0 = (iterator)&local_108;
  local_98 = 0x5b;
  std::allocator<unsigned_char>::allocator(&local_109);
  __l_02._M_len = local_98;
  __l_02._M_array = local_a0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)kTests,__l_02,&local_109);
  local_17a = 1;
  local_148 = 0x5580e9dafe6a8e2;
  uStack_140 = 0xe69f5b920431656e;
  local_158 = 0x64b6cd950e923bb3;
  uStack_150 = 0x940deacff0dc90e9;
  local_168 = 0xf8c765d1d59c631f;
  uStack_160 = 0x787d19272c072494;
  local_178 = 0xfe79c420f152c04;
  uStack_170 = 0xce62e0f52c256c21;
  local_138 = 0xc9;
  local_130 = (iterator)&local_178;
  local_128 = 0x41;
  std::allocator<unsigned_char>::allocator(&local_179);
  __l_01._M_len = local_128;
  __l_01._M_array = local_130;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &kTests[0].spki.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,__l_01,&local_179);
  local_17a = 0;
  local_90 = &kTests[0].encoded_point.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  kTests[0].encoded_point.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3b4;
  uStack_1a8 = 0x3b35b326;
  uStack_1a4 = 0x4c1cabd0a603a910;
  uStack_1b8 = 0xa4c19435db303058;
  uStack_1b0 = 0x7c5fb124;
  local_1ac = 0xec246672;
  local_1c8 = 0x652b030605302a30;
  uStack_1c0 = 0x6768dbe60021036e;
  local_190 = (iterator)&local_1c8;
  local_188 = 0x2c;
  std::allocator<unsigned_char>::allocator(&local_1c9);
  __l_00._M_len = local_188;
  __l_00._M_array = local_190;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(kTests + 1),__l_00,&local_1c9
            );
  __range1._6_1_ = 1;
  local_1f8 = 0x3b35b326ec246672;
  uStack_1f0 = 0x4c1cabd0a603a910;
  local_208 = 0xdb3030586768dbe6;
  uStack_200 = 0x7c5fb124a4c19435;
  local_1e0 = (iterator)&local_208;
  local_1d8 = 0x20;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&__range1 + 7));
  __l._M_len = local_1d8;
  __l._M_array = local_1e0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &kTests[1].spki.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,__l,
             (allocator<unsigned_char> *)((long)&__range1 + 7));
  __range1._6_1_ = 0;
  __range1._5_1_ = 0;
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&__range1 + 7));
  std::allocator<unsigned_char>::~allocator(&local_1c9);
  std::allocator<unsigned_char>::~allocator(&local_179);
  std::allocator<unsigned_char>::~allocator(&local_109);
  for (__end1 = (anon_struct_56_3_7c433676 *)local_88;
      __end1 != (anon_struct_56_3_7c433676 *)
                &kTests[1].encoded_point.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage; __end1 = __end1 + 1) {
    paStack_230 = __end1;
    testing::ScopedTrace::ScopedTrace<int>
              (&local_231,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
               ,0x4af,&__end1->pkey_type);
    bssl::Span<unsigned_char_const>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char_const> *)&spki.len,&paStack_230->spki);
    Bytes::Bytes(&local_248,stack0xfffffffffffffda8);
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_232,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
               ,0x4b0,&local_248);
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&paStack_230->spki);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&paStack_230->spki);
    CBS_init((CBS *)&from_spki,puVar2,sVar3);
    __p = EVP_parse_public_key((CBS *)&from_spki);
    std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&gtest_ar_.message_,__p);
    testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_280,
               (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
    if (!bVar1) {
      testing::Message::Message(&local_288);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2b0,(internal *)local_280,(AssertionResult *)"from_spki","false","true",
                 in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_290,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x4b4,pcVar4);
      testing::internal::AssertHelper::operator=(&local_290,&local_288);
      testing::internal::AssertHelper::~AssertHelper(&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      testing::Message::~Message(&local_288);
    }
    data._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
    if (data._4_4_ == 0) {
      peVar5 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )EVP_PKEY_get1_tls_encodedpoint(peVar5,(uint8_t **)&len);
      local_2dc = 0;
      testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
                ((internal *)local_2d8,"len","0u",(unsigned_long *)&gtest_ar.message_,&local_2dc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
      if (!bVar1) {
        testing::Message::Message(&local_2e8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x4b8,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_2e8);
      }
      data._4_4_ = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
      if (data._4_4_ == 0) {
        Bytes::Bytes(&local_310,(uint8_t *)len,
                     (size_t)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
        bssl::Span<unsigned_char_const>::
        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<unsigned_char_const> *)&local_330,&paStack_230->encoded_point);
        Bytes::Bytes(&local_320,local_330);
        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                  ((EqHelper *)local_300,"Bytes(data, len)","Bytes(test.encoded_point)",&local_310,
                   &local_320);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
        if (!bVar1) {
          testing::Message::Message(&local_338);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&from_encoded_point,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                     ,0x4b9,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&from_encoded_point,&local_338)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&from_encoded_point);
          testing::Message::~Message(&local_338);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
        OPENSSL_free((void *)len);
        pEVar6 = EVP_PKEY_new();
        std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,
                   (pointer)pEVar6);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_358,
                   (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
        if (!bVar1) {
          testing::Message::Message(&local_360);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__2.message_,(internal *)local_358,
                     (AssertionResult *)"from_encoded_point","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_368,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                     ,0x4bd,pcVar4);
          testing::internal::AssertHelper::operator=(&local_368,&local_360);
          testing::internal::AssertHelper::~AssertHelper(&local_368);
          std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_360);
        }
        data._4_4_ = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
        if (data._4_4_ == 0) {
          if (paStack_230->pkey_type == 0x198) {
            pEVar6 = (EVP_PKEY *)
                     std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                &gtest_ar__1.message_);
            from = (EVP_PKEY *)
                   std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
            local_39c = EVP_PKEY_copy_parameters(pEVar6,from);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_398,&local_39c,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
            if (!bVar1) {
              testing::Message::Message(&local_3a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__3.message_,(internal *)local_398,
                         (AssertionResult *)
                         "EVP_PKEY_copy_parameters(from_encoded_point.get(), from_spki.get())",
                         "false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_3b0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                         ,0x4c2,pcVar4);
              testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
              testing::internal::AssertHelper::~AssertHelper(&local_3b0);
              std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
              testing::Message::~Message(&local_3a8);
            }
            data._4_4_ = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
          }
          else {
            pEVar6 = (EVP_PKEY *)
                     std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                &gtest_ar__1.message_);
            local_3e4 = EVP_PKEY_set_type(pEVar6,paStack_230->pkey_type);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_3e0,&local_3e4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
            if (!bVar1) {
              testing::Message::Message(&local_3f0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__4.message_,(internal *)local_3e0,
                         (AssertionResult *)
                         "EVP_PKEY_set_type(from_encoded_point.get(), test.pkey_type)","false",
                         "true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_3f8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                         ,0x4c4,pcVar4);
              testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
              testing::internal::AssertHelper::~AssertHelper(&local_3f8);
              std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
              testing::Message::~Message(&local_3f0);
            }
            data._4_4_ = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
          }
          if (data._4_4_ == 0) {
            peVar5 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                &gtest_ar__1.message_);
            puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               (&paStack_230->encoded_point);
            sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              (&paStack_230->encoded_point);
            local_42c = EVP_PKEY_set1_tls_encodedpoint(peVar5,puVar2,sVar3);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_428,&local_42c,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
            if (!bVar1) {
              testing::Message::Message(&local_438);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)((long)&cbb.ctx_.u + 0x18),(internal *)local_428,
                         (AssertionResult *)
                         "EVP_PKEY_set1_tls_encodedpoint(from_encoded_point.get(), test.encoded_point.data(), test.encoded_point.size())"
                         ,"false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_440,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                         ,0x4c8,pcVar4);
              testing::internal::AssertHelper::operator=(&local_440,&local_438);
              testing::internal::AssertHelper::~AssertHelper(&local_440);
              std::__cxx11::string::~string((string *)((long)&cbb.ctx_.u + 0x18));
              testing::Message::~Message(&local_438);
            }
            data._4_4_ = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
            if (data._4_4_ == 0) {
              bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
                        ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                         &gtest_ar__5.message_);
              pcVar7 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  &gtest_ar__5.message_);
              sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                (&paStack_230->spki);
              local_4a4 = CBB_init(pcVar7,sVar3);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_4a0,&local_4a4,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
              if (!bVar1) {
                testing::Message::Message(&local_4b0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__6.message_,(internal *)local_4a0,
                           (AssertionResult *)"CBB_init(cbb.get(), test.spki.size())","false","true"
                           ,in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_4b8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                           ,0x4cb,pcVar4);
                testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
                testing::internal::AssertHelper::~AssertHelper(&local_4b8);
                std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
                testing::Message::~Message(&local_4b0);
              }
              data._4_4_ = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
              if (data._4_4_ == 0) {
                pcVar7 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                   ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                    &gtest_ar__5.message_);
                peVar5 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__1.message_);
                local_4ec = EVP_marshal_public_key(pcVar7,peVar5);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_4e8,&local_4ec,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_4e8);
                if (!bVar1) {
                  testing::Message::Message(&local_4f8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_2.message_,(internal *)local_4e8,
                             (AssertionResult *)
                             "EVP_marshal_public_key(cbb.get(), from_encoded_point.get())","false",
                             "true",in_R9);
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_500,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                             ,0x4cc,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_500,&local_4f8);
                  testing::internal::AssertHelper::~AssertHelper(&local_500);
                  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
                  testing::Message::~Message(&local_4f8);
                }
                data._4_4_ = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
                if (data._4_4_ == 0) {
                  pcVar7 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::
                           get((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                               &gtest_ar__5.message_);
                  data_arg = CBB_data(pcVar7);
                  pcVar7 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::
                           get((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                               &gtest_ar__5.message_);
                  len_arg = CBB_len(pcVar7);
                  Bytes::Bytes(&local_540,data_arg,len_arg);
                  bssl::Span<unsigned_char_const>::
                  Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            ((Span<unsigned_char_const> *)&local_560,&paStack_230->spki);
                  Bytes::Bytes(&local_550,local_560);
                  testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                            ((EqHelper *)local_530,"Bytes(CBB_data(cbb.get()), CBB_len(cbb.get()))",
                             "Bytes(test.spki)",&local_540,&local_550);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_530);
                  if (!bVar1) {
                    testing::Message::Message(&local_568);
                    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_530)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_570,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                               ,0x4cd,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_570,&local_568);
                    testing::internal::AssertHelper::~AssertHelper(&local_570);
                    testing::Message::~Message(&local_568);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
                  data._4_4_ = 0;
                }
              }
              bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                        ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                         &gtest_ar__5.message_);
            }
          }
        }
        std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      }
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    testing::ScopedTrace::~ScopedTrace(&local_232);
    testing::ScopedTrace::~ScopedTrace(&local_231);
    if (data._4_4_ != 0) goto LAB_00365ad1;
  }
  data._4_4_ = 0;
LAB_00365ad1:
  local_6b0 = (__0 *)&kTests[1].encoded_point.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
  do {
    local_6b0 = local_6b0 + -0x38;
    TestBody()::$_0::~__0(local_6b0);
  } while (local_6b0 != (__0 *)local_88);
  return;
}

Assistant:

TEST(EVPExtraTest, TLSEncodedPoint) {
  const struct {
    int pkey_type;
    std::vector<uint8_t> spki;
    std::vector<uint8_t> encoded_point;
  } kTests[] = {
      {EVP_PKEY_EC,
       {0x30, 0x59, 0x30, 0x13, 0x06, 0x07, 0x2a, 0x86, 0x48, 0xce, 0x3d, 0x02,
        0x01, 0x06, 0x08, 0x2a, 0x86, 0x48, 0xce, 0x3d, 0x03, 0x01, 0x07, 0x03,
        0x42, 0x00, 0x04, 0x2c, 0x15, 0x0f, 0x42, 0x9c, 0xe7, 0x0f, 0x21, 0x6c,
        0x25, 0x2c, 0xf5, 0xe0, 0x62, 0xce, 0x1f, 0x63, 0x9c, 0xd5, 0xd1, 0x65,
        0xc7, 0xf8, 0x94, 0x24, 0x07, 0x2c, 0x27, 0x19, 0x7d, 0x78, 0xb3, 0x3b,
        0x92, 0x0e, 0x95, 0xcd, 0xb6, 0x64, 0xe9, 0x90, 0xdc, 0xf0, 0xcf, 0xea,
        0x0d, 0x94, 0xe2, 0xa8, 0xe6, 0xaf, 0x9d, 0x0e, 0x58, 0x05, 0x6e, 0x65,
        0x31, 0x04, 0x92, 0x5b, 0x9f, 0xe6, 0xc9},
       {0x04, 0x2c, 0x15, 0x0f, 0x42, 0x9c, 0xe7, 0x0f, 0x21, 0x6c, 0x25,
        0x2c, 0xf5, 0xe0, 0x62, 0xce, 0x1f, 0x63, 0x9c, 0xd5, 0xd1, 0x65,
        0xc7, 0xf8, 0x94, 0x24, 0x07, 0x2c, 0x27, 0x19, 0x7d, 0x78, 0xb3,
        0x3b, 0x92, 0x0e, 0x95, 0xcd, 0xb6, 0x64, 0xe9, 0x90, 0xdc, 0xf0,
        0xcf, 0xea, 0x0d, 0x94, 0xe2, 0xa8, 0xe6, 0xaf, 0x9d, 0x0e, 0x58,
        0x05, 0x6e, 0x65, 0x31, 0x04, 0x92, 0x5b, 0x9f, 0xe6, 0xc9}},
      {EVP_PKEY_X25519,
       {0x30, 0x2a, 0x30, 0x05, 0x06, 0x03, 0x2b, 0x65, 0x6e, 0x03, 0x21,
        0x00, 0xe6, 0xdb, 0x68, 0x67, 0x58, 0x30, 0x30, 0xdb, 0x35, 0x94,
        0xc1, 0xa4, 0x24, 0xb1, 0x5f, 0x7c, 0x72, 0x66, 0x24, 0xec, 0x26,
        0xb3, 0x35, 0x3b, 0x10, 0xa9, 0x03, 0xa6, 0xd0, 0xab, 0x1c, 0x4c},
       {0xe6, 0xdb, 0x68, 0x67, 0x58, 0x30, 0x30, 0xdb, 0x35, 0x94, 0xc1,
        0xa4, 0x24, 0xb1, 0x5f, 0x7c, 0x72, 0x66, 0x24, 0xec, 0x26, 0xb3,
        0x35, 0x3b, 0x10, 0xa9, 0x03, 0xa6, 0xd0, 0xab, 0x1c, 0x4c}}};
  for (const auto& test : kTests) {
    SCOPED_TRACE(test.pkey_type);
    SCOPED_TRACE(Bytes(test.spki));
    CBS spki;
    CBS_init(&spki, test.spki.data(), test.spki.size());
    bssl::UniquePtr<EVP_PKEY> from_spki(EVP_parse_public_key(&spki));
    ASSERT_TRUE(from_spki);

    uint8_t *data;
    size_t len = EVP_PKEY_get1_tls_encodedpoint(from_spki.get(), &data);
    ASSERT_GT(len, 0u);
    EXPECT_EQ(Bytes(data, len), Bytes(test.encoded_point));
    OPENSSL_free(data);

    bssl::UniquePtr<EVP_PKEY> from_encoded_point(EVP_PKEY_new());
    ASSERT_TRUE(from_encoded_point);
    if (test.pkey_type == EVP_PKEY_EC) {
      // |EVP_PKEY_EC| should have been |EVP_PKEY_EC_P256|, etc., but instead
      // part of the type is buried inside parameters.
      ASSERT_TRUE(
          EVP_PKEY_copy_parameters(from_encoded_point.get(), from_spki.get()));
    } else {
      ASSERT_TRUE(EVP_PKEY_set_type(from_encoded_point.get(), test.pkey_type));
    }
    ASSERT_TRUE(EVP_PKEY_set1_tls_encodedpoint(from_encoded_point.get(),
                                               test.encoded_point.data(),
                                               test.encoded_point.size()));

    bssl::ScopedCBB cbb;
    ASSERT_TRUE(CBB_init(cbb.get(), test.spki.size()));
    ASSERT_TRUE(EVP_marshal_public_key(cbb.get(), from_encoded_point.get()));
    EXPECT_EQ(Bytes(CBB_data(cbb.get()), CBB_len(cbb.get())), Bytes(test.spki));
  }
}